

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef conv_str_tonum(jit_State *J,TRef tr,TValue *o)

{
  int iVar1;
  
  if ((tr & 0x1f000000) == 0x4000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5e8e0000;
    tr = lj_opt_fold(J);
    iVar1 = lj_strscan_num((GCstr *)(o->u64 & 0x7fffffffffff),o);
    if (iVar1 == 0) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  return tr;
}

Assistant:

static TRef conv_str_tonum(jit_State *J, TRef tr, TValue *o)
{
  if (tref_isstr(tr)) {
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    /* Would need an inverted STRTO for this rare and useless case. */
    if (!lj_strscan_num(strV(o), o))  /* Convert in-place. Value used below. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* Punt if non-numeric. */
  }
  return tr;
}